

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_functs.hpp
# Opt level: O0

bool Limonp::utf8ToUnicode
               (char *str,uint len,vector<unsigned_short,_std::allocator<unsigned_short>_> *vec)

{
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_RDX;
  uint in_ESI;
  long in_RDI;
  uint i;
  char ch2;
  char ch1;
  value_type *in_stack_ffffffffffffffb8;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_stack_ffffffffffffffc0;
  uint local_28;
  bool local_1;
  
  if (in_RDI == 0) {
    local_1 = false;
  }
  else {
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::clear
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x13472e);
    local_28 = 0;
    while (local_28 < in_ESI) {
      if (((int)*(char *)(in_RDI + (ulong)local_28) & 0x80U) == 0) {
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                  (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
        local_28 = local_28 + 1;
      }
      else if ((*(byte *)(in_RDI + (ulong)local_28) < 0xe0) && (local_28 + 1 < in_ESI)) {
        twocharToUint16(*(char *)(in_RDI + (ulong)local_28) >> 2 & 7,
                        *(byte *)(in_RDI + (ulong)(local_28 + 1)) & 0x3f |
                        *(char *)(in_RDI + (ulong)local_28) << 6);
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                  (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
        local_28 = local_28 + 2;
      }
      else {
        if ((0xef < *(byte *)(in_RDI + (ulong)local_28)) || (in_ESI <= local_28 + 2)) {
          return false;
        }
        in_stack_ffffffffffffffc0 = in_RDX;
        twocharToUint16(*(char *)(in_RDI + (ulong)local_28) << 4 |
                        *(char *)(in_RDI + (ulong)(local_28 + 1)) >> 2 & 0xfU,
                        *(char *)(in_RDI + (ulong)(local_28 + 1)) << 6 |
                        *(byte *)(in_RDI + (ulong)(local_28 + 2)) & 0x3f);
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                  (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
        local_28 = local_28 + 3;
      }
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

inline bool utf8ToUnicode(const char * const str, uint len, vector<uint16_t>& vec)
    {
        char ch1, ch2;
        if(!str)
        {
            return false;
        }
        vec.clear();
        for(uint i = 0;i < len;)
        {
            if(!(str[i] & 0x80)) // 0xxxxxxx
            {
                vec.push_back(str[i]);
                i++;
            }
            else if ((unsigned char)str[i] <= 0xdf && i + 1 < len) // 110xxxxxx
            {
                ch1 = (str[i] >> 2) & 0x07;
                ch2 = (str[i+1] & 0x3f) | ((str[i] & 0x03) << 6 );
                vec.push_back(twocharToUint16(ch1, ch2));
                i += 2;
            }
            else if((unsigned char)str[i] <= 0xef && i + 2 < len)
            {
                ch1 = (str[i] << 4) | ((str[i+1] >> 2) & 0x0f );
                ch2 = ((str[i+1]<<6) & 0xc0) | (str[i+2] & 0x3f); 
                vec.push_back(twocharToUint16(ch1, ch2));
                i += 3;
            }
            else
            {
                return false;
            }
        }
        return true;
    }